

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

void Vec_PtrSetEntry(Vec_Ptr_t *p,int i,void *Entry)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int nCapMin;
  long lVar4;
  
  iVar3 = p->nSize;
  if (iVar3 <= i) {
    iVar1 = i + 1;
    iVar2 = p->nCap * 2;
    nCapMin = iVar1;
    if ((iVar2 <= i) || (nCapMin = iVar2, p->nCap <= i)) {
      Vec_PtrGrow(p,nCapMin);
      iVar3 = p->nSize;
    }
    for (lVar4 = (long)iVar3; lVar4 < iVar1; lVar4 = lVar4 + 1) {
      p->pArray[lVar4] = (void *)0x0;
    }
    p->nSize = iVar1;
    iVar3 = iVar1;
  }
  if ((-1 < i) && (i < iVar3)) {
    p->pArray[(uint)i] = Entry;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

static inline void Vec_PtrSetEntry( Vec_Ptr_t * p, int i, void * Entry )
{
    Vec_PtrFillExtra( p, i + 1, NULL );
    Vec_PtrWriteEntry( p, i, Entry );
}